

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

quaternion dja::operator*(quaternion *a,float_t b)

{
  quaternion qVar1;
  
  qVar1.im.y = (a->im).y * b;
  qVar1.im.x = (a->im).x * b;
  qVar1.re = a->re * b;
  qVar1.im.z = b * (a->im).z;
  return qVar1;
}

Assistant:

Q OP*(const V1 a, const Q& b) {return Q(a * b.re, a * b.im);}